

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O2

void get_level(d_level *newlevel,int levnum)

{
  int iVar1;
  char cVar2;
  ulong uVar3;
  char cVar4;
  branch **ppbVar5;
  
  uVar3 = (ulong)(byte)u.uz.dnum;
  cVar2 = u.uz.dnum;
  cVar4 = u.uz.dlevel;
  if (0 < levnum) {
    iVar1 = dungeons[u.uz.dnum].depth_start;
    cVar4 = dungeons[u.uz.dnum].num_dunlevs;
    if (levnum < dungeons[u.uz.dnum].num_dunlevs + iVar1) {
      while (levnum < iVar1) {
        ppbVar5 = &branches;
        do {
          ppbVar5 = &((branch *)ppbVar5)->next->next;
          if ((branch *)ppbVar5 == (branch *)0x0) {
            panic("get_level: can\'t find parent dungeon");
          }
        } while ((((branch *)ppbVar5)->end2).dnum != (char)uVar3);
        cVar2 = (((branch *)ppbVar5)->end1).dnum;
        uVar3 = (ulong)cVar2;
        iVar1 = dungeons[uVar3].depth_start;
      }
      cVar4 = ((char)levnum - (char)iVar1) + '\x01';
    }
  }
  newlevel->dnum = cVar2;
  newlevel->dlevel = cVar4;
  return;
}

Assistant:

void get_level(d_level *newlevel, int levnum)
{
	branch *br;
	xchar dgn = u.uz.dnum;

	if (levnum <= 0) {
	    /* can only currently happen in endgame */
	    levnum = u.uz.dlevel;
	} else if (levnum > dungeons[dgn].depth_start
			    + dungeons[dgn].num_dunlevs - 1) {
	    /* beyond end of dungeon, jump to last level */
	    levnum = dungeons[dgn].num_dunlevs;
	} else {
	    /* The desired level is in this dungeon or a "higher" one. */

	    /*
	     * Branch up the tree until we reach a dungeon that contains the
	     * levnum.
	     */
	    if (levnum < dungeons[dgn].depth_start) {

		do {
		    /*
		     * Find the parent dungeon of this dungeon.
		     *
		     * This assumes that end2 is always the "child" and it is
		     * unique.
		     */
		    for (br = branches; br; br = br->next)
			if (br->end2.dnum == dgn) break;
		    if (!br)
			panic("get_level: can't find parent dungeon");

		    dgn = br->end1.dnum;
		} while (levnum < dungeons[dgn].depth_start);
	    }

	    /* We're within the same dungeon; calculate the level. */
	    levnum = levnum - dungeons[dgn].depth_start + 1;
	}

	newlevel->dnum = dgn;
	newlevel->dlevel = levnum;
}